

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_lzma(archive *a,la_zstream *lastrm,la_zaction action)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  int in_EDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  int r;
  lzma_stream *strm;
  int local_4;
  
  puVar1 = (undefined8 *)in_RSI[9];
  *puVar1 = *in_RSI;
  puVar1[1] = in_RSI[1];
  puVar1[2] = in_RSI[2];
  puVar1[3] = in_RSI[3];
  puVar1[4] = in_RSI[4];
  puVar1[5] = in_RSI[5];
  uVar2 = lzma_code(puVar1,(in_EDX == 0) * '\x03');
  *in_RSI = *puVar1;
  in_RSI[1] = puVar1[1];
  in_RSI[2] = puVar1[2];
  in_RSI[3] = puVar1[3];
  in_RSI[4] = puVar1[4];
  in_RSI[5] = puVar1[5];
  if (uVar2 == 0) {
    local_4 = 0;
  }
  else if (uVar2 == 1) {
    local_4 = 1;
  }
  else if (uVar2 == 6) {
    lVar3 = lzma_memusage(puVar1);
    archive_set_error(in_RDI,0xc,"lzma compression error: %ju MiB would have been needed",
                      lVar3 + 0xfffffU >> 0x14);
    local_4 = -0x1e;
  }
  else {
    archive_set_error(in_RDI,-1,"lzma compression failed: lzma_code() call returned status %d",
                      (ulong)uVar2);
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
compression_code_lzma(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	lzma_stream *strm;
	int r;

	strm = (lzma_stream *)lastrm->real_stream;
	strm->next_in = lastrm->next_in;
	strm->avail_in = lastrm->avail_in;
	strm->total_in = lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = lastrm->avail_out;
	strm->total_out = lastrm->total_out;
	r = lzma_code(strm,
	    (action == ARCHIVE_Z_FINISH)? LZMA_FINISH: LZMA_RUN);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case LZMA_OK:
		/* Non-finishing case */
		return (ARCHIVE_OK);
	case LZMA_STREAM_END:
		/* This return can only occur in finishing case. */
		return (ARCHIVE_EOF);
	case LZMA_MEMLIMIT_ERROR:
		archive_set_error(a, ENOMEM,
		    "lzma compression error:"
		    " %ju MiB would have been needed",
		    (uintmax_t)((lzma_memusage(strm) + 1024 * 1024 -1)
			/ (1024 * 1024)));
		return (ARCHIVE_FATAL);
	default:
		/* Any other return value indicates an error */
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma compression failed:"
		    " lzma_code() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}